

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportModule(ExpressionContext *ctx,SynBase *source,ByteCode *bytecode,Lexeme *lexStream,
                 uint lexStreamSize,InplaceStr name)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ModuleData *this;
  ModuleData **ppMVar4;
  Lexer *pLVar5;
  undefined1 local_2b0 [8];
  ModuleContext moduleCtx;
  ModuleData *local_58;
  ModuleData *moduleData;
  TraceScope traceScope;
  uint local_2c;
  Lexeme *pLStack_28;
  uint lexStreamSize_local;
  Lexeme *lexStream_local;
  ByteCode *bytecode_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)::token ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                                   ::token), iVar1 != 0)) {
    ImportModule::token = NULLC::TraceGetToken("analyze","ImportModule");
    __cxa_guard_release(&ImportModule(ExpressionContext&,SynBase*,ByteCode*,Lexeme*,unsigned_int,InplaceStr)
                         ::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&moduleData,ImportModule::token);
  if (bytecode == (ByteCode *)0x0) {
    __assert_fail("bytecode",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ac,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  if (*name.end != '\0') {
    __assert_fail("*name.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33ae,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  pcVar3 = strstr(name.begin,".nc");
  if (pcVar3 == (char *)0x0) {
    __assert_fail("strstr(name.begin, \".nc\") != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x33af,
                  "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                 );
  }
  this = ExpressionContext::get<ModuleData>(ctx);
  ModuleData::ModuleData(this,source,name);
  local_58 = this;
  SmallArray<ModuleData_*,_128U>::push_back(&ctx->imports,&local_58);
  uVar2 = SmallArray<ModuleData_*,_128U>::size(&ctx->imports);
  local_58->importIndex = uVar2;
  moduleCtx.data = (ModuleData *)name.begin;
  ppMVar4 = SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::find
                      (&ctx->uniqueDependencyMap,(InplaceStr *)&moduleCtx.data);
  if (ppMVar4 == (ModuleData **)0x0) {
    SmallArray<ModuleData_*,_128U>::push_back(&ctx->uniqueDependencies,&local_58);
  }
  local_58->bytecode = bytecode;
  local_2c = lexStreamSize;
  pLStack_28 = lexStream;
  if (lexStream == (Lexeme *)0x0) {
    pLVar5 = ExpressionContext::get<Lexer>(ctx);
    Lexer::Lexer(pLVar5,ctx->allocator);
    local_58->lexer = pLVar5;
    pLVar5 = local_58->lexer;
    pcVar3 = FindSource(bytecode);
    Lexer::Lexify(pLVar5,pcVar3);
    pLStack_28 = Lexer::GetStreamStart(local_58->lexer);
    local_2c = Lexer::GetStreamSize(local_58->lexer);
    if (*name.end != '\0') {
      __assert_fail("!*name.end",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x33c3,
                    "void ImportModule(ExpressionContext &, SynBase *, ByteCode *, Lexeme *, unsigned int, InplaceStr)"
                   );
    }
    BinaryCache::PutLexemes(name.begin,pLStack_28,local_2c);
  }
  local_58->lexStream = pLStack_28;
  local_58->lexStreamSize = local_2c;
  uVar2 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
  local_58->startingFunctionIndex = uVar2;
  ModuleContext::ModuleContext((ModuleContext *)local_2b0,ctx->allocator);
  moduleCtx.types.allocator = (Allocator *)local_58;
  ImportModuleDependencies(ctx,source,(ModuleContext *)local_2b0,local_58->bytecode);
  ImportModuleNamespaces(ctx,source,(ModuleContext *)local_2b0);
  ImportModuleTypes(ctx,source,(ModuleContext *)local_2b0);
  ImportModuleVariables(ctx,source,(ModuleContext *)local_2b0);
  ImportModuleTypedefs(ctx,source,(ModuleContext *)local_2b0);
  ImportModuleFunctions(ctx,source,(ModuleContext *)local_2b0);
  uVar2 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
  local_58->moduleFunctionCount = uVar2 - local_58->startingFunctionIndex;
  ModuleContext::~ModuleContext((ModuleContext *)local_2b0);
  NULLC::TraceScope::~TraceScope((TraceScope *)&moduleData);
  return;
}

Assistant:

void ImportModule(ExpressionContext &ctx, SynBase *source, ByteCode* bytecode, Lexeme *lexStream, unsigned lexStreamSize, InplaceStr name)
{
	TRACE_SCOPE("analyze", "ImportModule");

	assert(bytecode);

	assert(*name.end == 0);
	assert(strstr(name.begin, ".nc") != 0);

	ModuleData *moduleData = new (ctx.get<ModuleData>()) ModuleData(source, name);

	ctx.imports.push_back(moduleData);
	moduleData->importIndex = ctx.imports.size();

	if(!ctx.uniqueDependencyMap.find(InplaceStr(name)))
		ctx.uniqueDependencies.push_back(moduleData);

	moduleData->bytecode = bytecode;

	if(!lexStream)
	{
		moduleData->lexer = new (ctx.get<Lexer>()) Lexer(ctx.allocator);

		moduleData->lexer->Lexify(FindSource(bytecode));
		lexStream = moduleData->lexer->GetStreamStart();
		lexStreamSize = moduleData->lexer->GetStreamSize();

		assert(!*name.end);

		BinaryCache::PutLexemes(name.begin, lexStream, lexStreamSize);
	}

	moduleData->lexStream = lexStream;
	moduleData->lexStreamSize = lexStreamSize;

	moduleData->startingFunctionIndex = ctx.functions.size();

	ModuleContext moduleCtx(ctx.allocator);

	moduleCtx.data = moduleData;

	ImportModuleDependencies(ctx, source, moduleCtx, moduleData->bytecode);

	ImportModuleNamespaces(ctx, source, moduleCtx);

	ImportModuleTypes(ctx, source, moduleCtx);

	ImportModuleVariables(ctx, source, moduleCtx);

	ImportModuleTypedefs(ctx, source, moduleCtx);

	ImportModuleFunctions(ctx, source, moduleCtx);

	moduleData->moduleFunctionCount = ctx.functions.size() - moduleData->startingFunctionIndex;
}